

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int nodeAcquire(Rtree *pRtree,i64 iNode,RtreeNode *pParent,RtreeNode **ppNode)

{
  sqlite3_blob **ppBlob;
  sqlite3_blob *psVar1;
  RtreeNode *pRVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Incrblob *p;
  char *zTable;
  RtreeNode *p_00;
  RtreeNode *pRVar8;
  
  iVar4 = (int)((iNode & 0xffffffffU) * 0x51d07eaf >> 0x20);
  for (p_00 = pRtree->aHash[(int)iNode + (((uint)((int)iNode - iVar4) >> 1) + iVar4 >> 6) * -0x61];
      (p_00 != (RtreeNode *)0x0 && (p_00->iNode != iNode)); p_00 = p_00->pNext) {
  }
  if (p_00 == (RtreeNode *)0x0) {
    ppBlob = &pRtree->pNodeBlob;
    psVar1 = pRtree->pNodeBlob;
    if (psVar1 == (sqlite3_blob *)0x0) {
      iVar4 = 0;
    }
    else {
      *ppBlob = (sqlite3_blob *)0x0;
      iVar4 = sqlite3_blob_reopen(psVar1,iNode);
      *ppBlob = psVar1;
      if ((iVar4 != 0) && (nodeBlobReset(pRtree), iVar4 == 7)) {
        return 7;
      }
    }
    if (*ppBlob == (sqlite3_blob *)0x0) {
      zTable = sqlite3_mprintf("%s_node",pRtree->zName);
      if (zTable == (char *)0x0) {
        return 7;
      }
      iVar4 = sqlite3_blob_open(pRtree->db,pRtree->zDb,zTable,"data",iNode,0,ppBlob);
      sqlite3_free(zTable);
    }
    if (iVar4 == 0) {
      iVar4 = pRtree->iNodeSize;
      psVar1 = pRtree->pNodeBlob;
      iVar5 = 0;
      if ((psVar1 != (sqlite3_blob *)0x0) && (*(long *)(psVar1 + 0x18) != 0)) {
        iVar5 = *(int *)psVar1;
      }
      iVar6 = 0;
      if (iVar4 != iVar5) goto LAB_001cb4e5;
      iVar5 = sqlite3_initialize();
      if (iVar5 == 0) {
        p_00 = (RtreeNode *)sqlite3Malloc((long)iVar4 + 0x28);
      }
      else {
        p_00 = (RtreeNode *)0x0;
      }
      if (p_00 == (RtreeNode *)0x0) {
        iVar6 = 7;
        goto LAB_001cb4e5;
      }
      p_00->pParent = pParent;
      p_00->zData = (u8 *)(p_00 + 1);
      p_00->nRef = 1;
      pRtree->nNodeRef = pRtree->nNodeRef + 1;
      p_00->iNode = iNode;
      p_00->isDirty = 0;
      p_00->pNext = (RtreeNode *)0x0;
      iVar6 = blobReadWrite(pRtree->pNodeBlob,p_00 + 1,pRtree->iNodeSize,0,
                            sqlite3BtreePayloadChecked);
    }
    else {
      nodeBlobReset(pRtree);
      *ppNode = (RtreeNode *)0x0;
      iVar6 = 0x10b;
      if (iVar4 != 1) {
        iVar6 = iVar4;
      }
LAB_001cb4e5:
      p_00 = (RtreeNode *)0x0;
    }
    if (((iNode == 1) && (p_00 != (RtreeNode *)0x0)) &&
       (uVar3 = *(ushort *)p_00->zData << 8 | *(ushort *)p_00->zData >> 8,
       pRtree->iDepth = (uint)uVar3, 0x28 < uVar3)) {
      iVar6 = 0x10b;
    }
    if (((p_00 != (RtreeNode *)0x0) && (iVar6 == 0)) &&
       (iVar6 = 0x10b,
       (int)(uint)(ushort)(*(ushort *)(p_00->zData + 2) << 8 | *(ushort *)(p_00->zData + 2) >> 8) <=
       (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell)) {
      iVar6 = 0;
    }
    if (iVar6 != 0) {
      if (p_00 != (RtreeNode *)0x0) {
        pRtree->nNodeRef = pRtree->nNodeRef - 1;
        sqlite3_free(p_00);
      }
      p_00 = (RtreeNode *)0x0;
      goto LAB_001cb55c;
    }
    if (p_00 == (RtreeNode *)0x0) {
      iVar6 = 0x10b;
      goto LAB_001cb55c;
    }
    if (pParent != (RtreeNode *)0x0) {
      pParent->nRef = pParent->nRef + 1;
    }
    uVar7 = (uint)p_00->iNode % 0x61;
    p_00->pNext = pRtree->aHash[uVar7];
    pRtree->aHash[uVar7] = p_00;
  }
  else {
    if ((pParent != (RtreeNode *)0x0) && (pRVar2 = pParent, p_00->pParent == (RtreeNode *)0x0)) {
      do {
        pRVar8 = pRVar2;
        if (pRVar8 == p_00) {
          return 0x10b;
        }
        pRVar2 = pRVar8->pParent;
      } while (pRVar8->pParent != (RtreeNode *)0x0);
      if (pRVar8 == p_00) {
        return 0x10b;
      }
      pParent->nRef = pParent->nRef + 1;
      p_00->pParent = pParent;
    }
    p_00->nRef = p_00->nRef + 1;
  }
  iVar6 = 0;
LAB_001cb55c:
  *ppNode = p_00;
  return iVar6;
}

Assistant:

static int nodeAcquire(
  Rtree *pRtree,             /* R-tree structure */
  i64 iNode,                 /* Node number to load */
  RtreeNode *pParent,        /* Either the parent node or NULL */
  RtreeNode **ppNode         /* OUT: Acquired node */
){
  int rc = SQLITE_OK;
  RtreeNode *pNode = 0;

  /* Check if the requested node is already in the hash table. If so,
  ** increase its reference count and return it.
  */
  if( (pNode = nodeHashLookup(pRtree, iNode))!=0 ){
    assert( !pParent || !pNode->pParent || pNode->pParent==pParent );
    if( pParent && !pNode->pParent ){
      if( nodeInParentChain(pNode, pParent) ){
        RTREE_IS_CORRUPT(pRtree);
        return SQLITE_CORRUPT_VTAB;
      }
      pParent->nRef++;
      pNode->pParent = pParent;
    }
    pNode->nRef++;
    *ppNode = pNode;
    return SQLITE_OK;
  }

  if( pRtree->pNodeBlob ){
    sqlite3_blob *pBlob = pRtree->pNodeBlob;
    pRtree->pNodeBlob = 0;
    rc = sqlite3_blob_reopen(pBlob, iNode);
    pRtree->pNodeBlob = pBlob;
    if( rc ){
      nodeBlobReset(pRtree);
      if( rc==SQLITE_NOMEM ) return SQLITE_NOMEM;
    }
  }
  if( pRtree->pNodeBlob==0 ){
    char *zTab = sqlite3_mprintf("%s_node", pRtree->zName);
    if( zTab==0 ) return SQLITE_NOMEM;
    rc = sqlite3_blob_open(pRtree->db, pRtree->zDb, zTab, "data", iNode, 0,
                           &pRtree->pNodeBlob);
    sqlite3_free(zTab);
  }
  if( rc ){
    nodeBlobReset(pRtree);
    *ppNode = 0;
    /* If unable to open an sqlite3_blob on the desired row, that can only
    ** be because the shadow tables hold erroneous data. */
    if( rc==SQLITE_ERROR ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }else if( pRtree->iNodeSize==sqlite3_blob_bytes(pRtree->pNodeBlob) ){
    pNode = (RtreeNode *)sqlite3_malloc64(sizeof(RtreeNode)+pRtree->iNodeSize);
    if( !pNode ){
      rc = SQLITE_NOMEM;
    }else{
      pNode->pParent = pParent;
      pNode->zData = (u8 *)&pNode[1];
      pNode->nRef = 1;
      pRtree->nNodeRef++;
      pNode->iNode = iNode;
      pNode->isDirty = 0;
      pNode->pNext = 0;
      rc = sqlite3_blob_read(pRtree->pNodeBlob, pNode->zData,
                             pRtree->iNodeSize, 0);
    }
  }

  /* If the root node was just loaded, set pRtree->iDepth to the height
  ** of the r-tree structure. A height of zero means all data is stored on
  ** the root node. A height of one means the children of the root node
  ** are the leaves, and so on. If the depth as specified on the root node
  ** is greater than RTREE_MAX_DEPTH, the r-tree structure must be corrupt.
  */
  if( pNode && iNode==1 ){
    pRtree->iDepth = readInt16(pNode->zData);
    if( pRtree->iDepth>RTREE_MAX_DEPTH ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  /* If no error has occurred so far, check if the "number of entries"
  ** field on the node is too large. If so, set the return code to 
  ** SQLITE_CORRUPT_VTAB.
  */
  if( pNode && rc==SQLITE_OK ){
    if( NCELL(pNode)>((pRtree->iNodeSize-4)/pRtree->nBytesPerCell) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  if( rc==SQLITE_OK ){
    if( pNode!=0 ){
      nodeReference(pParent);
      nodeHashInsert(pRtree, pNode);
    }else{
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
    *ppNode = pNode;
  }else{
    if( pNode ){
      pRtree->nNodeRef--;
      sqlite3_free(pNode);
    }
    *ppNode = 0;
  }

  return rc;
}